

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_allocator.h
# Opt level: O2

uint8_t * flatbuffers::ReallocateDownward
                    (Allocator *allocator,uint8_t *old_p,size_t old_size,size_t new_size,
                    size_t in_use_back,size_t in_use_front)

{
  int iVar1;
  undefined4 extraout_var;
  uint8_t *puVar2;
  Allocator local_8;
  
  if (allocator != (Allocator *)0x0) {
    iVar1 = (*allocator->_vptr_Allocator[4])();
    return (uint8_t *)CONCAT44(extraout_var,iVar1);
  }
  local_8._vptr_Allocator = (_func_int **)&PTR__Allocator_00163c00;
  puVar2 = Allocator::reallocate_downward(&local_8,old_p,old_size,new_size,in_use_back,in_use_front)
  ;
  return puVar2;
}

Assistant:

inline uint8_t *ReallocateDownward(Allocator *allocator, uint8_t *old_p,
                                   size_t old_size, size_t new_size,
                                   size_t in_use_back, size_t in_use_front) {
  return allocator ? allocator->reallocate_downward(old_p, old_size, new_size,
                                                    in_use_back, in_use_front)
                   : DefaultAllocator().reallocate_downward(
                         old_p, old_size, new_size, in_use_back, in_use_front);
}